

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<IntVar::PropInfo>::push(vec<IntVar::PropInfo> *this,PropInfo *elem)

{
  int iVar1;
  int iVar2;
  PropInfo *pPVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = this->sz;
  if (uVar4 == this->cap) {
    uVar5 = 2;
    if (1 < uVar4) {
      uVar5 = (ulong)(uVar4 * 3 + 1 >> 1);
    }
    this->cap = (uint)uVar5;
    pPVar3 = (PropInfo *)realloc(this->data,uVar5 << 4);
    this->data = pPVar3;
    uVar4 = this->sz;
  }
  else {
    pPVar3 = this->data;
  }
  this->sz = uVar4 + 1;
  iVar1 = elem->pos;
  iVar2 = elem->eflags;
  pPVar3 = pPVar3 + uVar4;
  pPVar3->p = elem->p;
  pPVar3->pos = iVar1;
  pPVar3->eflags = iVar2;
  return;
}

Assistant:

void push(const T& elem) {
		if (sz == cap) {
			cap = cap <= 1 ? 2 : (cap * 3 + 1) >> 1;
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
		new (&data[sz++]) T(elem);
	}